

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

void __thiscall basist::approx_move_to_front::use(approx_move_to_front *this,uint32_t index)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  
  if (index == 0) {
    return;
  }
  uVar4 = index >> 1;
  uVar1 = (this->m_values).m_size;
  if ((uVar4 < uVar1) && (index < uVar1)) {
    piVar3 = (this->m_values).m_p;
    iVar2 = piVar3[uVar4];
    piVar3[uVar4] = piVar3[index];
    if (index < (this->m_values).m_size) {
      (this->m_values).m_p[index] = iVar2;
      return;
    }
  }
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                ,0x178,"T &basisu::vector<int>::operator[](size_t) [T = int]");
}

Assistant:

void use(uint32_t index)
		{
			if (index)
			{
				//std::swap(m_values[index / 2], m_values[index]);
				int x = m_values[index / 2];
				int y = m_values[index];
				m_values[index / 2] = y;
				m_values[index] = x;
			}
		}